

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

type fmt::v5::
     visit<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (precision_checker<fmt::v5::internal::error_handler> *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               arg)

{
  char *value;
  type_conflict1 tVar1;
  
  value = arg.value_.field_0._0_8_;
  switch(arg.type_) {
  case named_arg_type:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/format.h"
                  ,0x4b7,
                  "typename internal::result_of<Visitor (int)>::type fmt::visit(Visitor &&, basic_format_arg<Context>) [Visitor = fmt::internal::precision_checker<fmt::internal::error_handler>, Context = fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>]"
                 );
  case int_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                      (vis,arg.value_.field_0.int_value);
    return tVar1;
  case uint_type:
    value = (char *)(ulong)arg.value_.field_0.uint_value;
    break;
  case long_long_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                      (vis,(longlong)value);
    return tVar1;
  case ulong_long_type:
    break;
  case bool_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                      (vis,arg.value_.field_0.int_value != 0);
    return tVar1;
  case char_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                      (vis,arg.value_.field_0.int_value._0_1_);
    return tVar1;
  case double_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                      (vis,(double)value);
    return tVar1;
  case last_numeric_type:
    value = (char *)internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                              (vis,arg.value_.field_0._0_10_);
    break;
  case cstring_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()(vis,value);
    return tVar1;
  case string_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                      (vis,(basic_string_view<char>)arg.value_.field_0);
    return tVar1;
  case pointer_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()(vis,value);
    return tVar1;
  case custom_type:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                      (vis,(handle)arg.value_.field_0);
    return tVar1;
  default:
    tVar1 = internal::precision_checker<fmt::v5::internal::error_handler>::operator()();
    return tVar1;
  }
  return (type)value;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit(Visitor &&vis, basic_format_arg<Context> arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}